

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecryptionHelper.cpp
# Opt level: O0

void __thiscall DecryptionHelper::DecryptionHelper(DecryptionHelper *this)

{
  DecryptionHelper *this_local;
  
  this->_vptr_DecryptionHelper = (_func_int **)&PTR__DecryptionHelper_0054fe08;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XCryptionCommon_*>_>_>
  ::map(&this->mXcrypts);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(&this->mO);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(&this->mU);
  std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>::list(&this->mFileIDPart1);
  Reset(this);
  return;
}

Assistant:

DecryptionHelper::DecryptionHelper(void)
{
	Reset();
}